

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O2

void write_bounds<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::raw_problem>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,
               raw_problem *p)

{
  pointer pvVar1;
  long lVar2;
  int *in_R8;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar3 = (long)(p->vars).names.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(p->vars).names.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  lVar2 = 4;
  lVar4 = 0;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    pvVar1 = (p->vars).values.
             super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)((long)pvVar1 + lVar2 + -4) != 0) {
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[10],std::basic_string_view<char,std::char_traits<char>>const&,int_const&,true>
                ((v7 *)(ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                       container,(buffer_appender<char>)0x54c738,
                 (char (*) [10])
                 ((long)&((p->vars).names.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar4),
                 (basic_string_view<char,_std::char_traits<char>_> *)((long)pvVar1 + lVar2 + -4),
                 in_R8);
      pvVar1 = (p->vars).values.
               super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (*(int *)((long)&pvVar1->min + lVar2) != 0x7fffffff) {
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[10],std::basic_string_view<char,std::char_traits<char>>const&,int_const&,true>
                ((v7 *)(ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                       container,(buffer_appender<char>)0x559a23,
                 (char (*) [10])
                 ((long)&((p->vars).names.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar4),
                 (basic_string_view<char,_std::char_traits<char>_> *)((long)&pvVar1->min + lVar2),
                 in_R8);
    }
    lVar2 = lVar2 + 0xc;
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void
write_bounds(FormatContext& ctx, const Problem& p)
{
    for (std::size_t i{ 0 }, e{ p.vars.names.size() }; i != e; ++i) {
        if (p.vars.values[i].min != 0)
            fmt::format_to(
              ctx.out(), "{} >= {}\n", p.vars.names[i], p.vars.values[i].min);

        if (p.vars.values[i].max != std::numeric_limits<int>::max())
            fmt::format_to(
              ctx.out(), "{} <= {}\n", p.vars.names[i], p.vars.values[i].max);
    }
}